

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

char * big2_skipS(ENCODING *enc,char *ptr)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (*ptr == '\0') {
    while ((uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]), uVar3 < 0x16 &&
           ((0x200600U >> (uVar3 & 0x1f) & 1) != 0))) {
      pcVar1 = ptr + 2;
      pcVar2 = ptr + 2;
      ptr = pcVar1;
      if (*pcVar2 != '\0') {
        return pcVar1;
      }
    }
  }
  return ptr;
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr) {
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}